

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  ImportInfo *pIVar1;
  ulong uVar2;
  string *psVar3;
  string *local_68;
  ImportInfo *info;
  bool implib_local;
  string *config_local;
  cmTarget *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pIVar1 = GetImportInfo(this,config);
  if (pIVar1 != (ImportInfo *)0x0) {
    if (implib) {
      local_68 = (string *)&pIVar1->ImportLibrary;
    }
    else {
      local_68 = (string *)&pIVar1->Location;
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_68);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-NOTFOUND");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmTarget::ImportedGetFullPath(const std::string& config, bool implib) const
{
  std::string result;
  if(cmTarget::ImportInfo const* info = this->GetImportInfo(config))
    {
    result = implib? info->ImportLibrary : info->Location;
    }
  if(result.empty())
    {
    result = this->GetName();
    result += "-NOTFOUND";
    }
  return result;
}